

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

size_t stumpless_get_element_count(stumpless_entry *entry)

{
  size_t sVar1;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    sVar1 = 0;
  }
  else {
    pthread_lock_mutex((pthread_mutex_t *)entry->mutex);
    sVar1 = entry->element_count;
    pthread_unlock_mutex((pthread_mutex_t *)entry->mutex);
  }
  return sVar1;
}

Assistant:

size_t
stumpless_get_element_count( const struct stumpless_entry *entry ) {
  size_t count;

  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( entry );

  lock_entry( entry );
  count = entry->element_count;
  unlock_entry( entry );

  return count;
}